

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<bool,std::allocator<bool>>>
          (Attribute *this,vector<bool,_std::allocator<bool>_> *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  value_type *__x;
  optional<std::vector<bool,_std::allocator<bool>_>_> ret;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_78;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_48;
  
  if (v == (vector<bool,_std::allocator<bool>_> *)0x0) {
    local_78.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::vector<bool,std::allocator<bool>>>(&local_78,&this->_var);
    uVar2 = local_78.contained._16_8_;
    uVar1 = local_78.contained.data._0_8_;
    local_48.has_value_ = local_78.has_value_;
    if (local_78.has_value_ == true) {
      local_78.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_78.contained._8_4_ = 0;
      local_48.contained._32_8_ = local_78.contained._32_8_;
      local_78.contained._16_8_ = 0;
      local_48.contained._16_8_ = uVar2;
      local_78.contained._24_4_ = 0;
      local_48.contained.data.__align = (anon_struct_8_0_00000001_for___align)uVar1;
      local_78.contained._32_8_ = 0;
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                (&local_78);
      __x = nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::value
                      (&local_48);
      std::vector<bool,_std::allocator<bool>_>::operator=(v,__x);
    }
    else {
      nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                (&local_78);
    }
    nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional(&local_48)
    ;
  }
  return local_78.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }